

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManEquivImprove(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar6;
  long lVar7;
  ulong uVar8;
  int nCapMin;
  ulong uVar9;
  ulong uVar10;
  int local_48;
  int local_44;
  
  if ((p->pReprs == (Gia_Rpr_t *)0x0) || (p->pNexts == (int *)0x0)) {
    __assert_fail("p->pReprs != NULL && p->pNexts != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x616,"void Gia_ManEquivImprove(Gia_Man_t *)");
  }
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  p_01 = Vec_IntAlloc(100);
  uVar10 = 1;
  do {
    if ((long)p->nObjs <= (long)uVar10) {
      Vec_IntFree(p_01);
      if (p->pNexts != (int *)0x0) {
        free(p->pNexts);
        p->pNexts = (int *)0x0;
      }
      return;
    }
    iVar2 = Gia_ObjIsHead(p,(int)uVar10);
    if (iVar2 != 0) {
      p_01->nSize = 0;
      local_44 = 1000000000;
      uVar8 = 0xffffffffffffffff;
      local_48 = 1000000000;
      uVar9 = uVar10;
      while( true ) {
        iVar2 = (int)uVar9;
        iVar4 = (int)uVar8;
        if (iVar2 < 1) break;
        uVar8 = uVar8 & 0xffffffff;
        pGVar6 = Gia_ManObj(p,iVar2);
        iVar3 = Gia_ObjId(p,pGVar6);
        p_00 = p->vLevels;
        iVar4 = p_00->nSize;
        if (iVar4 <= iVar3) {
          iVar5 = iVar3 + 1;
          iVar1 = p_00->nCap * 2;
          nCapMin = iVar5;
          if ((iVar1 <= iVar3) || (nCapMin = iVar1, p_00->nCap <= iVar3)) {
            Vec_IntGrow(p_00,nCapMin);
            iVar4 = p_00->nSize;
          }
          for (lVar7 = (long)iVar4; lVar7 < iVar5; lVar7 = lVar7 + 1) {
            p_00->pArray[lVar7] = 0;
          }
          p_00->nSize = iVar5;
        }
        iVar4 = Vec_IntEntry(p_00,iVar3);
        pGVar6 = Gia_ManObj(p,iVar2);
        iVar3 = Gia_NodeMffcSize(p,pGVar6);
        if ((iVar4 < local_44) || ((local_44 == iVar4 && (iVar3 < local_48)))) {
          uVar8 = uVar9 & 0xffffffff;
          local_48 = iVar3;
          local_44 = iVar4;
        }
        Vec_IntPush(p_01,iVar2);
        uVar9 = (ulong)(uint)p->pNexts[uVar9 & 0xffffffff];
      }
      iVar2 = p_01->nSize;
      if (iVar2 < 2) {
        __assert_fail("Vec_IntSize( vClass ) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x62c,"void Gia_ManEquivImprove(Gia_Man_t *)");
      }
      if (iVar4 < 1) {
        __assert_fail("iReprBest > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x62d,"void Gia_ManEquivImprove(Gia_Man_t *)");
      }
      uVar8 = uVar8 & 0xffffffff;
      if (uVar10 != uVar8) {
        p->pReprs[uVar8] = (Gia_Rpr_t)((uint)p->pReprs[uVar8] | 0xfffffff);
        p->pReprs[uVar10] = (Gia_Rpr_t)((uint)p->pReprs[uVar10] | 0x10000000);
        p->pReprs[uVar8] = (Gia_Rpr_t)((uint)p->pReprs[uVar8] & 0xefffffff);
        for (iVar3 = 0; iVar2 != iVar3; iVar3 = iVar3 + 1) {
          iVar5 = Vec_IntEntry(p_01,iVar3);
          if (iVar5 != iVar4) {
            Gia_ObjSetRepr(p,iVar5,iVar4);
          }
        }
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void Gia_ManEquivImprove( Gia_Man_t * p )
{
    Vec_Int_t * vClass;
    int i, k, iNode, iRepr;
    int iReprBest, iLevelBest, iLevelCur, iMffcBest, iMffcCur;
    assert( p->pReprs != NULL && p->pNexts != NULL );
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        iReprBest = -1;
        iLevelBest = iMffcBest = ABC_INFINITY;
        Gia_ClassForEachObj( p, i, k )
        {
            iLevelCur = Gia_ObjLevel( p,Gia_ManObj(p, k) );
            iMffcCur  = Gia_NodeMffcSize( p, Gia_ManObj(p, k) );
            if ( iLevelBest > iLevelCur || (iLevelBest == iLevelCur && iMffcBest > iMffcCur) )
            {
                iReprBest  = k;
                iLevelBest = iLevelCur;
                iMffcBest  = iMffcCur;
            }
            Vec_IntPush( vClass, k );
        }
        assert( Vec_IntSize( vClass ) > 1 );
        assert( iReprBest > 0 );
        if ( i == iReprBest )
            continue;
/*
        Abc_Print( 1, "Repr/Best = %6d/%6d. Lev = %3d/%3d. Mffc = %3d/%3d.\n", 
            i, iReprBest, Gia_ObjLevel( p,Gia_ManObj(p, i) ), Gia_ObjLevel( p,Gia_ManObj(p, iReprBest) ),
            Gia_NodeMffcSize( p, Gia_ManObj(p, i) ), Gia_NodeMffcSize( p, Gia_ManObj(p, iReprBest) ) );
*/
        iRepr = iReprBest;
        Gia_ObjSetRepr( p, iRepr, GIA_VOID );
        Gia_ObjSetProved( p, i );
        Gia_ObjUnsetProved( p, iRepr );
        Vec_IntForEachEntry( vClass, iNode, k )
            if ( iNode != iRepr )
                Gia_ObjSetRepr( p, iNode, iRepr );
    }
    Vec_IntFree( vClass );
    ABC_FREE( p->pNexts );
//    p->pNexts = Gia_ManDeriveNexts( p );
}